

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti_tool.c
# Opt level: O0

int diff_field(field_s *fieldp,void *str0,void *str1,int nfields)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  nifti1_extension *ext1;
  nifti1_extension *ext0;
  int local_50;
  int size;
  int c;
  int fnum;
  char *cp1;
  char *cp0;
  field_s *fp;
  int nfields_local;
  void *str1_local;
  void *str0_local;
  field_s *fieldp_local;
  
  size = 0;
  cp0 = (char *)fieldp;
  do {
    if (nfields <= size) {
      return 0;
    }
    iVar1 = *(int *)cp0;
    if (iVar1 == -0xfff) {
LAB_0011158a:
      _c = (char *)((long)str1 + (long)*(int *)(cp0 + 4));
      local_50 = 0;
      for (cp1 = (char *)((long)str0 + (long)*(int *)(cp0 + 4));
          (local_50 < *(int *)(cp0 + 8) * *(int *)(cp0 + 0xc) && (*cp1 == *_c)); cp1 = cp1 + 1) {
        local_50 = local_50 + 1;
        _c = _c + 1;
      }
      if (local_50 < *(int *)(cp0 + 8) * *(int *)(cp0 + 0xc)) {
        return 1;
      }
    }
    else if (1 < iVar1 + 0xfefU) {
      if (iVar1 == -0xfed) {
        piVar2 = *(int **)((long)str0 + (long)*(int *)(cp0 + 4));
        piVar3 = *(int **)((long)str1 + (long)*(int *)(cp0 + 4));
        if ((piVar2 != (int *)0x0) || (piVar3 != (int *)0x0)) {
          if ((piVar2 != (int *)0x0) && (piVar3 == (int *)0x0)) {
            return 1;
          }
          if ((piVar2 == (int *)0x0) && (piVar3 != (int *)0x0)) {
            return 1;
          }
          if (*piVar2 != *piVar3) {
            return 1;
          }
          if (piVar2[1] != piVar3[1]) {
            return 1;
          }
        }
      }
      else if ((((iVar1 == 0) || (iVar1 == 4)) || (iVar1 == 8)) ||
              ((iVar1 == 0x10 || (iVar1 == 0x100)))) goto LAB_0011158a;
    }
    size = size + 1;
    cp0 = cp0 + 0x24;
  } while( true );
}

Assistant:

int diff_field(field_s *fieldp, void * str0, void * str1, int nfields)
{
   field_s * fp;
   char    * cp0, * cp1;
   int       fnum, c, size;

   fp = fieldp;
   for( fnum = 0; fnum < nfields; fnum++, fp++ )
   {
      switch( fp->type ){
         case DT_UNKNOWN:     /* all basic types are easy */
         case DT_INT8:
         case DT_INT16:
         case DT_INT32:
         case DT_FLOAT32:
         case NT_DT_STRING:
            size = fp->size * fp->len;  /* total field size */
            cp0 = (char *)str0 + fp->offset;
            cp1 = (char *)str1 + fp->offset;
            for( c = 0; c < size; c++, cp0++, cp1++ )
               if( *cp0 != *cp1 ) break;

            if(c < size) return 1;  /* found a diff */

            break;

         case NT_DT_POINTER:     /* let's pass on these - no diff */
         case NT_DT_CHAR_PTR:

            break;

         case NT_DT_EXT_PTR:
         {
            nifti1_extension * ext0, * ext1;

            ext0 = *(nifti1_extension **)((char *)str0 + fp->offset);
            ext1 = *(nifti1_extension **)((char *)str1 + fp->offset);

            if( ! ext0 && ! ext1 ) break;     /* continue on */

            if( ext0 && ! ext1 )   return 1;  /* pointer diff is diff */
            if( ! ext0 && ext1 )   return 1;

            /* just check size and type for a single extension */
            if( ext0->esize != ext1->esize ) return 1;
            if( ext0->ecode != ext1->ecode ) return 1;

            break;
         }
      }
   }

   return 0;   /* no diffs found */
}